

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

bool __thiscall
google::
dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::unserialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
          (dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,StringIO *param_2)

{
  string *psVar1;
  size_type sVar2;
  ulong uVar3;
  StringIO *pSVar4;
  bool bVar5;
  ulong uVar6;
  size_t __n;
  int bit;
  long lVar7;
  uchar bits;
  size_type new_num_buckets;
  MagicNumberType magic_read;
  byte local_55;
  uint local_54;
  long local_50;
  StringIO *local_48;
  size_type local_40;
  unsigned_long local_38;
  
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)this);
  bVar5 = sparsehash_internal::read_bigendian_number<StringIO,unsigned_long>(param_2,&local_38,4);
  if (((bVar5) && (local_38 == 0x13578642)) &&
     (bVar5 = sparsehash_internal::read_bigendian_number<StringIO,unsigned_long>
                        (param_2,&local_40,8), bVar5)) {
    dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear_to_size((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)this,local_40);
    bVar5 = sparsehash_internal::read_bigendian_number<StringIO,unsigned_long>
                      (param_2,(unsigned_long *)(this + 0x50),8);
    if (bVar5) {
      if (*(long *)(this + 0x58) == 0) {
        return true;
      }
      local_50 = 0;
      uVar6 = 0;
      local_48 = param_2;
      while( true ) {
        psVar1 = local_48->s_;
        sVar2 = psVar1->_M_string_length;
        memcpy(&local_55,(psVar1->_M_dataplus)._M_p,(ulong)(sVar2 != 0));
        std::__cxx11::string::erase((ulong)psVar1,0);
        if (sVar2 == 0) break;
        local_54 = (uint)local_55;
        lVar7 = 0;
        do {
          pSVar4 = local_48;
          if ((lVar7 + uVar6 < *(ulong *)(this + 0x58)) &&
             ((local_54 >> ((uint)lVar7 & 0x1f) & 1) != 0)) {
            uVar3 = local_48->s_->_M_string_length;
            __n = 4;
            if (uVar3 < 4) {
              __n = uVar3;
            }
            memcpy((void *)(*(long *)(this + 0x70) + local_50 + lVar7 * 4),
                   (local_48->s_->_M_dataplus)._M_p,__n);
            std::__cxx11::string::erase((ulong)pSVar4->s_,0);
            if (uVar3 < 4) {
              return false;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        uVar6 = uVar6 + 8;
        local_50 = local_50 + 0x20;
        if (*(ulong *)(this + 0x58) <= uVar6) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool unserialize(ValueSerializer serializer, INPUT* fp) {
    assert(settings.use_empty() && "empty_key not set for read");

    clear();  // just to be consistent
    MagicNumberType magic_read;
    if (!sparsehash_internal::read_bigendian_number(fp, &magic_read, 4))
      return false;
    if (magic_read != MAGIC_NUMBER) {
      return false;
    }
    size_type new_num_buckets;
    if (!sparsehash_internal::read_bigendian_number(fp, &new_num_buckets, 8))
      return false;
    clear_to_size(new_num_buckets);
    if (!sparsehash_internal::read_bigendian_number(fp, &num_elements, 8))
      return false;

    // Read the bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits;
      if (!sparsehash_internal::read_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && (bits & (1 << bit))) {  // not empty
          if (!serializer(fp, &table[i + bit])) return false;
        }
      }
    }
    return true;
  }